

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O1

void __thiscall FParser::SF_PlayerSelectedWeapon(FParser *this)

{
  undefined8 *puVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  PClassActor *type;
  AInventory *pAVar6;
  undefined8 uVar7;
  char **ppcVar8;
  int i;
  long lVar9;
  
  if (this->t_argc < 1) {
    script_error("Insufficient parameters for \'%s\'\n",(this->t_func).Chars);
    return;
  }
  iVar3 = T_GetPlayerNum(this->t_argv);
  if (this->t_argc == 2) {
    uVar4 = intvalue(this->t_argv + 1);
    if (8 < uVar4) {
      script_error("weaponnum out of range! %s\n",(ulong)uVar4);
      return;
    }
    type = PClass::FindActor(SF_PlayerWeapon::WeaponNames[uVar4]);
    if (type == (PClassActor *)0x0) {
      script_error("incompatibility in playerweapon\n",(ulong)uVar4);
      return;
    }
    pAVar6 = AActor::FindInventory((AActor *)(&players)[(long)iVar3 * 0x54],type,false);
    *(AInventory **)(&DAT_00a39368 + (long)iVar3 * 0x2a0) = pAVar6;
  }
  (this->t_return).type = 1;
  ppcVar8 = SF_PlayerWeapon::WeaponNames;
  lVar9 = 0;
  while( true ) {
    puVar1 = *(undefined8 **)(&DAT_00a39360 + (long)iVar3 * 0x2a0);
    if (puVar1[1] == 0) {
      uVar7 = (**(code **)*puVar1)(puVar1);
      puVar1[1] = uVar7;
    }
    lVar2 = puVar1[1];
    iVar5 = FName::NameManager::FindName(&FName::NameData,*ppcVar8,false);
    if (*(int *)(lVar2 + 0x88) == iVar5) break;
    lVar9 = lVar9 + 1;
    ppcVar8 = ppcVar8 + 1;
    if (lVar9 == 9) {
      return;
    }
  }
  (this->t_return).value.i = (int)lVar9;
  return;
}

Assistant:

void FParser::SF_PlayerSelectedWeapon()
{
	int playernum;
	int weaponnum;


	static const char * const WeaponNames[]={
		"Fist", "Pistol", "Shotgun", "Chaingun", "RocketLauncher", 
		"PlasmaRifle", "BFG9000", "Chainsaw", "SuperShotgun" };


	if (CheckArgs(1))
	{
		playernum=T_GetPlayerNum(t_argv[0]);

		if(t_argc == 2)
		{
			weaponnum = intvalue(t_argv[1]);

			if (weaponnum<0 || weaponnum>=9)
			{
				script_error("weaponnum out of range! %s\n", weaponnum);
				return;
			}
			PClassWeapon * ti = static_cast<PClassWeapon *>(PClass::FindActor(WeaponNames[weaponnum]));
			if (!ti)
			{
				script_error("incompatibility in playerweapon\n", weaponnum);
				return;
			}

			players[playernum].PendingWeapon = (AWeapon*)players[playernum].mo->FindInventory(ti);

		} 
		t_return.type = svt_int;
		for(int i=0;i<9;i++)
		{
			if (players[playernum].ReadyWeapon->GetClass ()->TypeName == FName(WeaponNames[i]))
			{
				t_return.value.i=i;
				break;
			}
		}
	}
}